

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactDirTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactDirTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  cmGeneratorTarget *target;
  string result;
  string local_40;
  
  target = TargetArtifactBase::GetTarget
                     (&this->super_TargetArtifactBase,parameters,context,content,dagChecker);
  if (target == (cmGeneratorTarget *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    TargetFilesystemArtifactDependencyCMP0112::AddDependency(target,context);
    TargetFilesystemArtifactResultCreator<ArtifactPdbTag>::Create_abi_cxx11_
              (&local_40,(TargetFilesystemArtifactResultCreator<ArtifactPdbTag> *)target,
               (cmGeneratorTarget *)context,(cmGeneratorExpressionContext *)content,
               (GeneratorExpressionContent *)dagChecker);
    if (context->HadError == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,&local_40);
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    cmGeneratorTarget* target =
      this->GetTarget(parameters, context, content, dagChecker);
    if (!target) {
      return std::string();
    }
    // Not a dependent target if we are querying for ArtifactDirTag,
    // ArtifactNameTag, ArtifactBundleDirTag, ArtifactBundleDirNameTag,
    // and ArtifactBundleContentDirTag
    TargetFilesystemArtifactDependency<ArtifactT, ComponentT>::AddDependency(
      target, context);

    std::string result =
      TargetFilesystemArtifactResultCreator<ArtifactT>::Create(target, context,
                                                               content);
    if (context->HadError) {
      return std::string();
    }
    return TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }